

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O3

string * __thiscall
duckdb::Linenoise::AddContinuationMarkers_abi_cxx11_
          (string *__return_storage_ptr__,Linenoise *this,char *buf,size_t len,int plen,
          int cursor_row,vector<duckdb::highlightToken,_true> *tokens)

{
  undefined7 uVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  reference pvVar6;
  char *pcVar7;
  int iVar8;
  pointer phVar9;
  ulong uVar10;
  tokenType tVar11;
  char *pcVar12;
  size_type __n;
  vector<duckdb::highlightToken,_true> new_tokens;
  int rows;
  int cols;
  size_t local_c0;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> local_b8;
  int local_94;
  int local_90;
  int local_8c;
  char *local_88;
  char *local_80;
  highlightToken local_78;
  int local_60;
  int local_5c;
  Linenoise *local_58;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  long local_40;
  size_t local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_8c = 1;
  local_c0 = 0;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_94 = plen;
  local_90 = cursor_row;
  local_5c = plen;
  local_58 = this;
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (&local_b8,
             ((long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (len == 0) {
    pcVar7 = (char *)0x0;
    __n = 0;
  }
  else {
    local_40 = (long)local_94;
    uVar10 = 0;
    pcVar7 = (char *)0x0;
    __n = 0;
    uVar3 = 0;
    local_50 = len;
    do {
      bVar2 = IsNewline(buf[uVar3]);
      NextPosition(local_58,buf,local_50,&local_c0,&local_8c,&local_5c,local_94);
      for (; uVar10 < local_c0; uVar10 = uVar10 + 1) {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      if (bVar2) {
        local_60 = local_8c;
        puVar4 = &continuationPrompt;
        if (local_8c == local_90) {
          puVar4 = &continuationSelectedPrompt;
        }
        pcVar12 = anon_var_dwarf_63f17de + 9;
        if (local_58->continuation_markers != false) {
          pcVar12 = (char *)*puVar4;
        }
        local_88 = pcVar7;
        local_38 = strlen(pcVar12);
        local_80 = pcVar12;
        sVar5 = ComputeRenderWidth(pcVar12,local_38);
        iVar8 = local_94 - (int)sVar5;
        if (iVar8 != 0 && (int)sVar5 <= local_94) {
          do {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        pcVar12 = local_88;
        pcVar7 = (char *)((local_40 - sVar5) + local_38);
        if (__n < (ulong)(((long)(tokens->
                                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ).
                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(tokens->
                                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ).
                                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
          do {
            local_80 = pcVar7;
            pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            if (local_c0 <= pvVar6->start) {
              if (__n == 0) {
                __n = 0;
                goto LAB_00219dbb;
              }
              break;
            }
            pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            pvVar6->start = (size_t)(pcVar12 + pvVar6->start);
            pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
            if (local_b8.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
              _M_realloc_insert<duckdb::highlightToken_const&>
                        ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                         &local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pvVar6);
            }
            else {
              uVar1 = *(undefined7 *)&pvVar6->field_0x11;
              (local_b8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->search_match = pvVar6->search_match;
              *(undefined7 *)
               &(local_b8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar1;
              uVar1 = *(undefined7 *)&pvVar6->field_0x1;
              sVar5 = pvVar6->start;
              (local_b8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->type = pvVar6->type;
              *(undefined7 *)
               &(local_b8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar1;
              (local_b8.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish)->start = sVar5;
              local_b8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_b8.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            __n = __n + 1;
            pcVar7 = local_80;
          } while (__n < (ulong)(((long)(tokens->
                                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ).
                                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(tokens->
                                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ).
                                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
          if (__n < ((long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    1U) {
            pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n - 1);
            tVar11 = pvVar6->type;
          }
          else {
LAB_00219dbb:
            tVar11 = TOKEN_IDENTIFIER;
          }
          local_78.start = (size_t)(local_88 + local_c0);
          local_78.type = local_60 == local_90 | TOKEN_CONTINUATION;
          local_78.search_match = false;
          if (local_b8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            *(ulong *)&(local_b8.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 (ulong)(uint7)local_78._17_7_ << 8;
            *(ulong *)local_b8.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                 CONCAT71(local_78._1_7_,local_60 == local_90) | 6;
            (local_b8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_78.start;
            local_b8.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pcVar7 = local_80 + (long)local_88;
          local_78.start = (size_t)(pcVar7 + local_c0);
          local_78.search_match = false;
          local_78.type = tVar11;
          if (local_b8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            *(ulong *)&(local_b8.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 (ulong)(uint7)local_78._17_7_ << 8;
            *(ulong *)local_b8.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish = CONCAT71(local_78._1_7_,tVar11);
            (local_b8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_78.start;
            local_b8.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          pcVar7 = pcVar7 + (long)local_88;
        }
      }
      uVar3 = local_c0;
    } while (local_c0 < local_50);
    if (uVar10 < local_c0) {
      do {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar10 = uVar10 + 1;
      } while (uVar10 < local_c0);
    }
  }
  phVar9 = (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (__n < (ulong)(((long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)phVar9 >> 3) *
                   -0x5555555555555555)) {
    do {
      pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
      pvVar6->start = (size_t)(pcVar7 + pvVar6->start);
      pvVar6 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
      if (local_b8.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                   &local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pvVar6);
      }
      else {
        uVar1 = *(undefined7 *)&pvVar6->field_0x11;
        (local_b8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->search_match = pvVar6->search_match;
        *(undefined7 *)
         &(local_b8.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar1;
        uVar1 = *(undefined7 *)&pvVar6->field_0x1;
        sVar5 = pvVar6->start;
        (local_b8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->type = pvVar6->type;
        *(undefined7 *)
         &(local_b8.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar1;
        (local_b8.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->start = sVar5;
        local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
      phVar9 = (tokens->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (__n < (ulong)(((long)(tokens->
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ).
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)phVar9 >> 3) *
                          -0x5555555555555555));
  }
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((phVar9 != (pointer)0x0) &&
     (operator_delete(phVar9),
     local_b8.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_b8.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string Linenoise::AddContinuationMarkers(const char *buf, size_t len, int plen, int cursor_row,
                                         vector<highlightToken> &tokens) const {
	std::string result;
	int rows = 1;
	int cols = plen;
	size_t cpos = 0;
	size_t prev_pos = 0;
	size_t extra_bytes = 0;    // extra bytes introduced
	size_t token_position = 0; // token position
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size());
	while (cpos < len) {
		bool is_newline = IsNewline(buf[cpos]);
		NextPosition(buf, len, cpos, rows, cols, plen);
		for (; prev_pos < cpos; prev_pos++) {
			result += buf[prev_pos];
		}
		if (is_newline) {
			bool is_cursor_row = rows == cursor_row;
			const char *prompt = is_cursor_row ? continuationSelectedPrompt : continuationPrompt;
			if (!continuation_markers) {
				prompt = "";
			}
			size_t continuationLen = strlen(prompt);
			size_t continuationRender = ComputeRenderWidth(prompt, continuationLen);
			// pad with spaces prior to prompt
			for (int i = int(continuationRender); i < plen; i++) {
				result += " ";
			}
			result += prompt;
			size_t continuationBytes = plen - continuationRender + continuationLen;
			if (token_position < tokens.size()) {
				for (; token_position < tokens.size(); token_position++) {
					if (tokens[token_position].start >= cpos) {
						// not there yet
						break;
					}
					tokens[token_position].start += extra_bytes;
					new_tokens.push_back(tokens[token_position]);
				}
				tokenType prev_type = tokenType::TOKEN_IDENTIFIER;
				if (token_position > 0 && token_position < tokens.size() + 1) {
					prev_type = tokens[token_position - 1].type;
				}
				highlightToken token;
				token.start = cpos + extra_bytes;
				token.type = is_cursor_row ? tokenType::TOKEN_CONTINUATION_SELECTED : tokenType::TOKEN_CONTINUATION;
				token.search_match = false;
				new_tokens.push_back(token);

				token.start = cpos + extra_bytes + continuationBytes;
				token.type = prev_type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			extra_bytes += continuationBytes;
		}
	}
	for (; prev_pos < cpos; prev_pos++) {
		result += buf[prev_pos];
	}
	for (; token_position < tokens.size(); token_position++) {
		tokens[token_position].start += extra_bytes;
		new_tokens.push_back(tokens[token_position]);
	}
	tokens = std::move(new_tokens);
	return result;
}